

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
::find<google::protobuf::(anonymous_namespace)::ParentNumberQuery>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
           *this,key_arg<google::protobuf::(anonymous_namespace)::ParentNumberQuery> *key)

{
  ctrl_t *pcVar1;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  *this_00;
  void *pvVar2;
  ctrl_t *pcVar3;
  EnumDescriptor *pEVar4;
  uint uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ushort uVar24;
  uint64_t v;
  slot_type *ppEVar25;
  anon_union_8_1_a8a14541_for_iterator_2 aVar26;
  undefined1 (*pauVar27) [16];
  uintptr_t v_2;
  ulong extraout_RDX;
  ulong uVar28;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  *prVar29;
  uint uVar30;
  ulong uVar31;
  long lVar32;
  undefined1 uVar33;
  uint uVar34;
  ulong uVar35;
  size_t cap_2;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  __m128i match;
  undefined1 auVar42 [16];
  iterator iVar43;
  undefined1 auVar44 [16];
  ctrl_t cVar36;
  ctrl_t cVar39;
  ctrl_t cVar40;
  ctrl_t cVar41;
  
  AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              *)(this->settings_).
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_);
  if (1 < (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    pvVar2 = (key->query).first;
    uVar35 = ((ulong)pvVar2 ^ 0x572bc8) * -0x234dd359734ecb13;
    uVar35 = ((uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
               (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
               (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 | (uVar35 & 0xff00) << 0x28
              | uVar35 << 0x38) ^ (ulong)pvVar2) * -0x234dd359734ecb13;
    uVar35 = (uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
              (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
              (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 | (uVar35 & 0xff00) << 0x28 |
             uVar35 << 0x38) ^ (ulong)(uint)(key->query).second;
    prVar29 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
               *)(this->settings_).
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
    if (prVar29 ==
        (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
         *)0x1) {
      ppEVar25 = soo_slot(this);
      pEVar4 = (*ppEVar25)->type_;
      if (((EnumDescriptor *)(key->query).first == pEVar4) &&
         (uVar34 = (*ppEVar25)->number_, (key->query).second == uVar34)) {
        uVar28 = ((ulong)pEVar4 ^ 0x572bc8) * -0x234dd359734ecb13;
        uVar28 = ((uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                   (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                   (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                   (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38) ^ (ulong)pEVar4) *
                 -0x234dd359734ecb13;
        if (uVar35 != ((uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                        (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                        (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                        (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38) ^ (ulong)uVar34)) {
LAB_0022b497:
          __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xfbf,
                        "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::AssertHashEqConsistent(const google::protobuf::(anonymous namespace)::ParentNumberQuery &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>]"
                       );
        }
      }
    }
    else {
      if (prVar29 ==
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
           *)0x0) goto LAB_0022b5ae;
      if (prVar29 < (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                     *)0x11) {
        lVar32 = *(long *)((long)&(this->settings_).
                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                  .
                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                  .value.heap_or_soo_ + 8);
        slot_array(prVar29);
        uVar28 = (this->settings_).
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        pauVar27 = (undefined1 (*) [16])
                   (this->settings_).
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.control;
        if (uVar28 < 0xf) {
          if (8 < uVar28) {
            __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x78b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::EnumValueDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
          uVar28 = *(ulong *)(*pauVar27 + uVar28) & 0x8080808080808080;
          if (uVar28 != 0x8080808080808080) {
            uVar28 = uVar28 ^ 0x8080808080808080;
            pvVar2 = (key->query).first;
            uVar34 = (key->query).second;
            uVar31 = ((ulong)pvVar2 ^ 0x572bc8) * -0x234dd359734ecb13;
            uVar31 = ((uVar31 >> 0x38 | (uVar31 & 0xff000000000000) >> 0x28 |
                       (uVar31 & 0xff0000000000) >> 0x18 | (uVar31 & 0xff00000000) >> 8 |
                       (uVar31 & 0xff000000) << 8 | (uVar31 & 0xff0000) << 0x18 |
                       (uVar31 & 0xff00) << 0x28 | uVar31 << 0x38) ^ (ulong)pvVar2) *
                     -0x234dd359734ecb13;
            do {
              lVar6 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                }
              }
              lVar6 = *(long *)(lVar32 + -8 + (ulong)((uint)lVar6 & 0xfffffff8));
              if (((pvVar2 == *(void **)(lVar6 + 0x10)) && (uVar34 == *(uint *)(lVar6 + 4))) &&
                 (uVar35 != ((uVar31 >> 0x38 | (uVar31 & 0xff000000000000) >> 0x28 |
                              (uVar31 & 0xff0000000000) >> 0x18 | (uVar31 & 0xff00000000) >> 8 |
                              (uVar31 & 0xff000000) << 8 | (uVar31 & 0xff0000) << 0x18 |
                              (uVar31 & 0xff00) << 0x28 | uVar31 << 0x38) ^ (ulong)uVar34)))
              goto LAB_0022b497;
              uVar28 = uVar28 & uVar28 - 1;
            } while (uVar28 != 0);
          }
        }
        else {
          uVar28 = (this->settings_).
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.size_;
          if (1 < uVar28) {
            uVar28 = uVar28 >> 1;
            pvVar2 = (key->query).first;
            uVar34 = (key->query).second;
            uVar31 = ((ulong)pvVar2 ^ 0x572bc8) * -0x234dd359734ecb13;
            uVar31 = ((uVar31 >> 0x38 | (uVar31 & 0xff000000000000) >> 0x28 |
                       (uVar31 & 0xff0000000000) >> 0x18 | (uVar31 & 0xff00000000) >> 8 |
                       (uVar31 & 0xff000000) << 8 | (uVar31 & 0xff0000) << 0x18 |
                       (uVar31 & 0xff00) << 0x28 | uVar31 << 0x38) ^ (ulong)pvVar2) *
                     -0x234dd359734ecb13;
            do {
              auVar37 = *pauVar27;
              uVar30 = (uint)(ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar37[0xf] >> 7) << 0xf);
              if (uVar30 != 0xffff) {
                uVar30 = ~uVar30;
                do {
                  uVar5 = 0;
                  if (uVar30 != 0) {
                    for (; (uVar30 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                    }
                  }
                  if ((char)(*pauVar27)[uVar5] < '\0') {
                    __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                  ,0x79d,
                                  "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::EnumValueDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                                 );
                  }
                  lVar6 = *(long *)(lVar32 + (ulong)uVar5 * 8);
                  if (((pvVar2 == *(void **)(lVar6 + 0x10)) && (uVar34 == *(uint *)(lVar6 + 4))) &&
                     (uVar35 != ((uVar31 >> 0x38 | (uVar31 & 0xff000000000000) >> 0x28 |
                                  (uVar31 & 0xff0000000000) >> 0x18 | (uVar31 & 0xff00000000) >> 8 |
                                  (uVar31 & 0xff000000) << 8 | (uVar31 & 0xff0000) << 0x18 |
                                  (uVar31 & 0xff00) << 0x28 | uVar31 << 0x38) ^ (ulong)uVar34)))
                  goto LAB_0022b497;
                  uVar28 = uVar28 - 1;
                  uVar24 = (ushort)(uVar30 - 1) & (ushort)uVar30;
                  uVar30 = CONCAT22((short)(uVar30 - 1 >> 0x10),uVar24);
                } while (uVar24 != 0);
                if (uVar28 == 0) break;
              }
              pauVar27 = pauVar27 + 1;
              lVar32 = lVar32 + 0x80;
              if (auVar37[0xf] == 0xff) {
                __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x7a5,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::EnumValueDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                             );
              }
            } while( true );
          }
        }
      }
    }
  }
  AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              *)(this->settings_).
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_);
  prVar29 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             *)(this->settings_).
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
  if (prVar29 !=
      (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
       *)0x1) {
    if (prVar29 !=
        (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
         *)0x0) {
      prefetch_heap_block(prVar29);
      this_00 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                 *)(this->settings_).
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.capacity_;
      if (this_00 ==
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
           *)0x1) {
        __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe2a,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>, K = google::protobuf::(anonymous namespace)::ParentNumberQuery]"
                     );
      }
      if (this_00 !=
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
           *)0x0) {
        if (((ulong)((long)&(this_00->settings_).
                            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                            .
                            super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                            .value.capacity_ + 1U) & (ulong)this_00) != 0) {
          __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x14c,
                        "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                       );
        }
        pvVar2 = (key->query).first;
        uVar35 = ((ulong)pvVar2 ^ 0x572bc8) * -0x234dd359734ecb13;
        uVar35 = ((uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
                   (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
                   (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 |
                   (uVar35 & 0xff00) << 0x28 | uVar35 << 0x38) ^ (ulong)pvVar2) *
                 -0x234dd359734ecb13;
        uVar35 = ((uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
                   (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
                   (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 |
                   (uVar35 & 0xff00) << 0x28 | uVar35 << 0x38) ^ (ulong)(uint)(key->query).second) *
                 -0x234dd359734ecb13;
        pcVar3 = (this->settings_).
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.heap_or_soo_.heap.control;
        uVar28 = (uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
                  (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
                  (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 |
                  (uVar35 & 0xff00) << 0x28 | uVar35 << 0x38) >> 7 ^ (ulong)pcVar3 >> 0xc;
        control(this_00);
        uVar33 = (undefined1)(uVar35 >> 0x38);
        auVar37 = ZEXT216(CONCAT11(uVar33,uVar33) & 0x7f7f);
        auVar37 = pshuflw(auVar37,auVar37,0);
        uVar35 = 0;
        while( true ) {
          uVar28 = uVar28 & (ulong)this_00;
          pcVar1 = pcVar3 + uVar28;
          cVar8 = *pcVar1;
          cVar9 = pcVar1[1];
          cVar10 = pcVar1[2];
          cVar11 = pcVar1[3];
          cVar12 = pcVar1[4];
          cVar13 = pcVar1[5];
          cVar14 = pcVar1[6];
          cVar15 = pcVar1[7];
          cVar16 = pcVar1[8];
          cVar17 = pcVar1[9];
          cVar18 = pcVar1[10];
          cVar19 = pcVar1[0xb];
          cVar20 = pcVar1[0xc];
          cVar21 = pcVar1[0xd];
          cVar22 = pcVar1[0xe];
          cVar23 = pcVar1[0xf];
          cVar36 = auVar37[0];
          auVar38[0] = -(cVar36 == cVar8);
          cVar39 = auVar37[1];
          auVar38[1] = -(cVar39 == cVar9);
          cVar40 = auVar37[2];
          auVar38[2] = -(cVar40 == cVar10);
          cVar41 = auVar37[3];
          auVar38[3] = -(cVar41 == cVar11);
          auVar38[4] = -(cVar36 == cVar12);
          auVar38[5] = -(cVar39 == cVar13);
          auVar38[6] = -(cVar40 == cVar14);
          auVar38[7] = -(cVar41 == cVar15);
          auVar38[8] = -(cVar36 == cVar16);
          auVar38[9] = -(cVar39 == cVar17);
          auVar38[10] = -(cVar40 == cVar18);
          auVar38[0xb] = -(cVar41 == cVar19);
          auVar38[0xc] = -(cVar36 == cVar20);
          auVar38[0xd] = -(cVar39 == cVar21);
          auVar38[0xe] = -(cVar40 == cVar22);
          auVar38[0xf] = -(cVar41 == cVar23);
          uVar24 = (ushort)(SUB161(auVar38 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar38[0xf] >> 7) << 0xf;
          uVar34 = (uint)uVar24;
          while (uVar24 != 0) {
            uVar30 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
              }
            }
            pvVar2 = (this->settings_).
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.heap_or_soo_.heap.slot_array.p;
            slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                        *)(this->settings_).
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.capacity_);
            uVar31 = uVar30 + uVar28 & (ulong)this_00;
            lVar32 = *(long *)((long)pvVar2 + uVar31 * 8);
            if ((*(void **)(lVar32 + 0x10) == (key->query).first) &&
               (*(int *)(lVar32 + 4) == (key->query).second)) {
              iVar43 = iterator_at(this,uVar31);
              auVar44._0_8_ = iVar43.ctrl_;
              auVar44._8_8_ = iVar43.field_1;
              return (iterator)auVar44;
            }
            uVar24 = (ushort)(uVar34 - 1) & (ushort)uVar34;
            uVar34 = CONCAT22((short)(uVar34 - 1 >> 0x10),uVar24);
          }
          auVar42[0] = -(cVar8 == kEmpty);
          auVar42[1] = -(cVar9 == kEmpty);
          auVar42[2] = -(cVar10 == kEmpty);
          auVar42[3] = -(cVar11 == kEmpty);
          auVar42[4] = -(cVar12 == kEmpty);
          auVar42[5] = -(cVar13 == kEmpty);
          auVar42[6] = -(cVar14 == kEmpty);
          auVar42[7] = -(cVar15 == kEmpty);
          auVar42[8] = -(cVar16 == kEmpty);
          auVar42[9] = -(cVar17 == kEmpty);
          auVar42[10] = -(cVar18 == kEmpty);
          auVar42[0xb] = -(cVar19 == kEmpty);
          auVar42[0xc] = -(cVar20 == kEmpty);
          auVar42[0xd] = -(cVar21 == kEmpty);
          auVar42[0xe] = -(cVar22 == kEmpty);
          auVar42[0xf] = -(cVar23 == kEmpty);
          prVar29 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                     *)(this->settings_).
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.capacity_;
          if ((((((((((((((((auVar42 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar42 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar42 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar42 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar42 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar42 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar42 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar42 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar42 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar42 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar42 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar42 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              cVar23 == kEmpty) break;
          if (prVar29 ==
              (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
               *)0x0) goto LAB_0022b5ae;
          uVar28 = uVar35 + uVar28 + 0x10;
          uVar35 = uVar35 + 0x10;
          if (prVar29 < uVar35) {
            __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xe37,
                          "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>, K = google::protobuf::(anonymous namespace)::ParentNumberQuery]"
                         );
          }
        }
        goto LAB_0022b4b9;
      }
    }
LAB_0022b5ae:
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>]"
                 );
  }
  prVar29 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             *)0x1;
  if (1 < (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    ppEVar25 = soo_slot(this);
    if (((*ppEVar25)->type_ == (EnumDescriptor *)(key->query).first) &&
       ((*ppEVar25)->number_ == (key->query).second)) {
      aVar26.slot_ = soo_slot(this);
      auVar37._0_8_ = kSooControl;
      auVar37._8_8_ = aVar26;
      return (iterator)auVar37;
    }
    prVar29 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
               *)(this->settings_).
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
  }
LAB_0022b4b9:
  AssertNotDebugCapacity(prVar29);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = extraout_RDX;
  return (iterator)(auVar7 << 0x40);
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertOnFind(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }